

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_e58190::HandleGenerateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  mode_t permissions;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string *inputFile;
  cmake *pcVar5;
  ostream *poVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  const_iterator __begin2;
  pointer arg;
  const_iterator __end2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  string_view name_06;
  static_string_view name_07;
  mode_t local_440;
  cmNewLineStyle newLineStyle;
  string local_438;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  conditionCge;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  outputCge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidOptions;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_3d8;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_3d0;
  cmListFileBacktrace lfbt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  string errorMessage;
  _Any_data local_358;
  __buckets_ptr local_348;
  pointer ppStack_340;
  __node_base local_338;
  pointer ppStack_330;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_218;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_208;
  cmGeneratorExpression conditionGe;
  cmGeneratorExpression outputGe;
  undefined1 local_1c8 [32];
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *local_1a8;
  pointer local_1a0;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_198 [2];
  Arguments arguments;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x81) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errorMessage,"Incorrect arguments to GENERATE subcommand.",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&errorMessage);
    return false;
  }
  if (((anonymous_namespace)::
       HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_338._M_nxt = (_Hash_node_base *)0x0;
    ppStack_330 = (pointer)0x0;
    local_348 = (__buckets_ptr)0x0;
    ppStack_340 = (pointer)0x0;
    local_358._0_8_ = 0;
    local_358._8_8_ = 0;
    errorMessage.field_2._M_allocated_capacity = 0;
    errorMessage.field_2._8_8_ = 0;
    errorMessage._M_dataplus._M_p = (pointer)0x0;
    errorMessage._M_string_length = 0;
    name.super_string_view._M_str = "OUTPUT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name,0x30);
    name_00.super_string_view._M_str = "INPUT";
    name_00.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_00,0x58);
    name_01.super_string_view._M_str = "CONTENT";
    name_01.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_01,0x80);
    name_02.super_string_view._M_str = "CONDITION";
    name_02.super_string_view._M_len = 9;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_02,0xa8);
    name_03.super_string_view._M_str = "TARGET";
    name_03.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_03,0xd0);
    name_04.super_string_view._M_str = "NO_SOURCE_PERMISSIONS";
    name_04.super_string_view._M_len = 0x15;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&errorMessage,name_04,0x120);
    name_05.super_string_view._M_str = "USE_SOURCE_PERMISSIONS";
    name_05.super_string_view._M_len = 0x16;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&errorMessage,name_05,0x121);
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
    ;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x128;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_manager;
    name_06._M_str = "FILE_PERMISSIONS";
    name_06._M_len = 0x10;
    ArgumentParser::Base::Bind((Base *)&errorMessage,name_06,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    name_07.super_string_view._M_str = "NEWLINE_STYLE";
    name_07.super_string_view._M_len = 0xd;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_07,0xf8);
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
    ;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x140;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:347:7)>
         ::_M_invoke;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:347:7)>
           ::_M_manager;
    ArgumentParser::Base::BindParsedKeyword((Base *)&errorMessage,(KeywordNameAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleGenerateCommand::parser,(ActionMap *)&errorMessage);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&errorMessage);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleGenerateCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  errorMessage.field_2._M_allocated_capacity = (size_type)&unparsedArguments;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_438._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  arguments.Output.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Input.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Content.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Condition.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Target.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.NewLineStyle.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.NoSourcePermissions = false;
  arguments.UseSourcePermissions = false;
  arguments.FilePermissions.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.FilePermissions.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.FilePermissions.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.ParsedKeywords.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.ParsedKeywords.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.ParsedKeywords.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errorMessage._M_dataplus._M_p = (pointer)&HandleGenerateCommand::parser;
  errorMessage._M_string_length = (size_type)&arguments;
  local_358._0_8_ = 0;
  local_358._8_8_ = 0;
  local_348 = (__buckets_ptr)0x0;
  ppStack_340 = (pointer)0x0;
  local_338._M_nxt = local_338._M_nxt & 0xffffffffffffff00;
  errorMessage.field_2._8_8_ = errorMessage._M_string_length;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&errorMessage,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_438,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_358);
  bVar2 = ArgumentParser::ParseResult::MaybeReportError
                    (&arguments.super_ParseResult,status->Makefile);
  bVar3 = true;
  if (bVar2) goto LAB_0033ba07;
  if (unparsedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unparsedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((arguments.Output.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged != true) ||
       (__y._M_str = "OUTPUT", __y._M_len = 6,
       bVar2 = std::operator!=(*arguments.ParsedKeywords.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,__y), bVar2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errorMessage,"GENERATE requires OUTPUT as first option.",
                 (allocator<char> *)&local_438);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if ((arguments.Input.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged != false) ||
         (arguments.Content.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged != false)) {
        __y_00._M_str = "CONTENT";
        __y_00._M_len = 7;
        bVar2 = std::operator==(arguments.ParsedKeywords.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1],__y_00);
        if (bVar2) {
          inputFile = (string *)&arguments.Content;
        }
        else {
          __y_01._M_str = "INPUT";
          __y_01._M_len = 5;
          bVar3 = std::operator!=(arguments.ParsedKeywords.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1],__y_01);
          if (bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&errorMessage,"Unknown argument to GENERATE subcommand.",
                       (allocator<char> *)&local_438);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0033b9f8;
          }
          inputFile = (string *)&arguments.Input;
        }
        if (arguments.Condition.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          if (arguments.Condition.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&errorMessage,
                       "CONDITION of sub-command GENERATE must not be empty if specified.",
                       (allocator<char> *)&local_438);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0033b9f8;
          }
          std::__cxx11::string::string((string *)&local_1a8,(string *)&arguments.Condition);
        }
        else {
          local_1a8 = local_198;
          local_1a0 = (pointer)0x0;
          local_198[0]._M_t.
          super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>._M_t.
          super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>.
          super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl._0_1_ = 0;
        }
        if (arguments.Target.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          if (arguments.Target.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length != 0) {
            std::__cxx11::string::string((string *)local_1c8,(string *)&arguments.Target);
            goto LAB_0033bba0;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&errorMessage,
                     "TARGET of sub-command GENERATE must not be empty if specified.",
                     (allocator<char> *)&local_438);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&errorMessage);
          bVar3 = false;
        }
        else {
          local_1c8._0_8_ = local_1c8 + 0x10;
          local_1c8._8_8_ = (pointer)0x0;
          local_1c8[0x10] = '\0';
LAB_0033bba0:
          cmNewLineStyle::cmNewLineStyle(&newLineStyle);
          if (arguments.NewLineStyle.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == true) {
            errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
            errorMessage._M_string_length = 0;
            errorMessage.field_2._M_allocated_capacity =
                 errorMessage.field_2._M_allocated_capacity & 0xffffffffffffff00;
            bVar3 = cmNewLineStyle::ReadFromArguments(&newLineStyle,args,&errorMessage);
            if (bVar3) {
              std::__cxx11::string::~string((string *)&errorMessage);
              goto LAB_0033bbf2;
            }
            cmStrCat<char_const(&)[10],std::__cxx11::string&>
                      (&local_438,(char (*) [10])"GENERATE ",&errorMessage);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            std::__cxx11::string::~string((string *)&local_438);
LAB_0033bf9b:
            std::__cxx11::string::~string((string *)&errorMessage);
LAB_0033bfa8:
            bVar3 = false;
          }
          else {
LAB_0033bbf2:
            pbVar1 = arguments.FilePermissions.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (arguments.NoSourcePermissions == true) {
              if (arguments.UseSourcePermissions == true) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&errorMessage,
                           "given both NO_SOURCE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                           ,(allocator<char> *)&local_438);
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              else {
                if (arguments.FilePermissions.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    arguments.FilePermissions.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0033bd8a;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&errorMessage,
                           "given both NO_SOURCE_PERMISSIONS and FILE_PERMISSIONS. Only one option allowed."
                           ,(allocator<char> *)&local_438);
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              goto LAB_0033bf9b;
            }
            if (arguments.FilePermissions.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                arguments.FilePermissions.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if ((arguments._288_2_ & 0x100) != 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&errorMessage,
                           "given both USE_SOURCE_PERMISSIONS and FILE_PERMISSIONS. Only one option allowed."
                           ,(allocator<char> *)&local_438);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_0033bf9b;
              }
              if ((arguments.UseSourcePermissions & bVar2) == 1) goto LAB_0033bf6e;
              local_440 = 0;
              invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              for (arg = arguments.FilePermissions.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; arg != pbVar1; arg = arg + 1) {
                bVar3 = cmFSPermissions::stringToModeT(arg,&local_440);
                if (!bVar3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&invalidOptions,arg);
                }
              }
              if (invalidOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  invalidOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&invalidOptions);
                goto LAB_0033bda3;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMessage);
              std::operator<<((ostream *)&errorMessage,"given invalid permission ");
              for (uVar8 = 0; uVar9 = (ulong)uVar8,
                  uVar9 < (ulong)((long)invalidOptions.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)invalidOptions.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5);
                  uVar8 = uVar8 + 1) {
                pcVar7 = "\"";
                if (uVar9 != 0) {
                  pcVar7 = ",\"";
                }
                poVar6 = std::operator<<((ostream *)&errorMessage,pcVar7);
                poVar6 = std::operator<<(poVar6,(string *)
                                                (invalidOptions.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar9))
                ;
                std::operator<<(poVar6,"\"");
              }
              std::operator<<((ostream *)&errorMessage,".");
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_assign((string *)&status->Error);
              std::__cxx11::string::~string((string *)&local_438);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMessage);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&invalidOptions);
              goto LAB_0033bfa8;
            }
LAB_0033bd8a:
            if ((bVar2 & arguments.UseSourcePermissions) != 0) {
LAB_0033bf6e:
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&errorMessage,
                         "given USE_SOURCE_PERMISSIONS without a file INPUT.",
                         (allocator<char> *)&local_438);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_0033bf9b;
            }
            local_440 = 0x1a4;
            if (arguments.NoSourcePermissions == false) {
              local_440 = 0;
            }
LAB_0033bda3:
            cmNewLineStyle::GetCharacters_abi_cxx11_((string *)&invalidOptions,&newLineStyle);
            permissions = local_440;
            cmMakefile::GetBacktrace((cmMakefile *)&lfbt);
            pcVar5 = cmMakefile::GetCMakeInstance(status->Makefile);
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_208,
                           (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            *)&lfbt);
            cmGeneratorExpression::cmGeneratorExpression
                      (&outputGe,pcVar5,(cmListFileBacktrace *)&local_208);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount)
            ;
            std::__cxx11::string::string((string *)&errorMessage,(string *)&arguments.Output);
            cmGeneratorExpression::Parse((cmGeneratorExpression *)&outputCge,(string *)&outputGe);
            std::__cxx11::string::~string((string *)&errorMessage);
            pcVar5 = cmMakefile::GetCMakeInstance(status->Makefile);
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_218,
                           (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            *)&lfbt);
            cmGeneratorExpression::cmGeneratorExpression
                      (&conditionGe,pcVar5,(cmListFileBacktrace *)&local_218);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount)
            ;
            std::__cxx11::string::string((string *)&local_438,(string *)&local_1a8);
            cmGeneratorExpression::Parse
                      ((cmGeneratorExpression *)&conditionCge,(string *)&conditionGe);
            std::__cxx11::string::~string((string *)&local_438);
            local_3d0 = outputCge;
            outputCge._M_t.
            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
                  )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    )0x0;
            local_3d8 = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         )(unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           )conditionCge._M_t.
                            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                            _M_head_impl;
            conditionCge._M_t.
            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
                  )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    )0x0;
            cmMakefile::AddEvaluationFile
                      (status->Makefile,inputFile,(string *)local_1c8,&local_3d0,&local_3d8,
                       (string *)&invalidOptions,permissions,bVar2);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&local_3d8);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&local_3d0);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&conditionCge);
            cmGeneratorExpression::~cmGeneratorExpression(&conditionGe);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&outputCge);
            cmGeneratorExpression::~cmGeneratorExpression(&outputGe);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::string::~string((string *)&invalidOptions);
            bVar3 = true;
          }
          std::__cxx11::string::~string((string *)local_1c8);
        }
        std::__cxx11::string::~string((string *)&local_1a8);
        goto LAB_0033ba07;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errorMessage,"GENERATE requires INPUT or CONTENT option.",
                 (allocator<char> *)&local_438);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errorMessage,"Unknown argument to GENERATE subcommand.",
               (allocator<char> *)&local_438);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_0033b9f8:
  std::__cxx11::string::~string((string *)&errorMessage);
  bVar3 = false;
LAB_0033ba07:
  HandleGenerateCommand::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  return bVar3;
}

Assistant:

bool HandleGenerateCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 5) {
    status.SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<std::string> Output;
    cm::optional<std::string> Input;
    cm::optional<std::string> Content;
    cm::optional<std::string> Condition;
    cm::optional<std::string> Target;
    cm::optional<std::string> NewLineStyle;
    bool NoSourcePermissions = false;
    bool UseSourcePermissions = false;
    ArgumentParser::NonEmpty<std::vector<std::string>> FilePermissions;
    std::vector<cm::string_view> ParsedKeywords;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("INPUT"_s, &Arguments::Input)
      .Bind("CONTENT"_s, &Arguments::Content)
      .Bind("CONDITION"_s, &Arguments::Condition)
      .Bind("TARGET"_s, &Arguments::Target)
      .Bind("NO_SOURCE_PERMISSIONS"_s, &Arguments::NoSourcePermissions)
      .Bind("USE_SOURCE_PERMISSIONS"_s, &Arguments::UseSourcePermissions)
      .Bind("FILE_PERMISSIONS"_s, &Arguments::FilePermissions)
      .Bind("NEWLINE_STYLE"_s, &Arguments::NewLineStyle)
      .BindParsedKeywords(&Arguments::ParsedKeywords);

  std::vector<std::string> unparsedArguments;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(1), &unparsedArguments);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!unparsedArguments.empty()) {
    status.SetError("Unknown argument to GENERATE subcommand.");
    return false;
  }

  if (!arguments.Output || arguments.ParsedKeywords[0] != "OUTPUT"_s) {
    status.SetError("GENERATE requires OUTPUT as first option.");
    return false;
  }
  std::string const& output = *arguments.Output;

  if (!arguments.Input && !arguments.Content) {
    status.SetError("GENERATE requires INPUT or CONTENT option.");
    return false;
  }
  const bool inputIsContent = arguments.ParsedKeywords[1] == "CONTENT"_s;
  if (!inputIsContent && arguments.ParsedKeywords[1] != "INPUT") {
    status.SetError("Unknown argument to GENERATE subcommand.");
    return false;
  }
  std::string const& input =
    inputIsContent ? *arguments.Content : *arguments.Input;

  if (arguments.Condition && arguments.Condition->empty()) {
    status.SetError("CONDITION of sub-command GENERATE must not be empty "
                    "if specified.");
    return false;
  }
  std::string const& condition =
    arguments.Condition ? *arguments.Condition : std::string();

  if (arguments.Target && arguments.Target->empty()) {
    status.SetError("TARGET of sub-command GENERATE must not be empty "
                    "if specified.");
    return false;
  }
  std::string const& target =
    arguments.Target ? *arguments.Target : std::string();

  cmNewLineStyle newLineStyle;
  if (arguments.NewLineStyle) {
    std::string errorMessage;
    if (!newLineStyle.ReadFromArguments(args, errorMessage)) {
      status.SetError(cmStrCat("GENERATE ", errorMessage));
      return false;
    }
  }

  if (arguments.NoSourcePermissions && arguments.UseSourcePermissions) {
    status.SetError("given both NO_SOURCE_PERMISSIONS and "
                    "USE_SOURCE_PERMISSIONS. Only one option allowed.");
    return false;
  }

  if (!arguments.FilePermissions.empty()) {
    if (arguments.NoSourcePermissions) {
      status.SetError("given both NO_SOURCE_PERMISSIONS and "
                      "FILE_PERMISSIONS. Only one option allowed.");
      return false;
    }
    if (arguments.UseSourcePermissions) {
      status.SetError("given both USE_SOURCE_PERMISSIONS and "
                      "FILE_PERMISSIONS. Only one option allowed.");
      return false;
    }
  }

  if (arguments.UseSourcePermissions) {
    if (inputIsContent) {
      status.SetError("given USE_SOURCE_PERMISSIONS without a file INPUT.");
      return false;
    }
  }

  mode_t permissions = 0;
  if (arguments.NoSourcePermissions) {
    permissions |= cmFSPermissions::mode_owner_read;
    permissions |= cmFSPermissions::mode_owner_write;
    permissions |= cmFSPermissions::mode_group_read;
    permissions |= cmFSPermissions::mode_world_read;
  }

  if (!arguments.FilePermissions.empty()) {
    std::vector<std::string> invalidOptions;
    for (auto const& e : arguments.FilePermissions) {
      if (!cmFSPermissions::stringToModeT(e, permissions)) {
        invalidOptions.push_back(e);
      }
    }
    if (!invalidOptions.empty()) {
      std::ostringstream oss;
      oss << "given invalid permission ";
      for (auto i = 0u; i < invalidOptions.size(); i++) {
        if (i == 0u) {
          oss << "\"" << invalidOptions[i] << "\"";
        } else {
          oss << ",\"" << invalidOptions[i] << "\"";
        }
      }
      oss << ".";
      status.SetError(oss.str());
      return false;
    }
  }

  AddEvaluationFile(input, target, output, condition, inputIsContent,
                    newLineStyle.GetCharacters(), permissions, status);
  return true;
}